

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O2

bool __thiscall cmDocumentation::PrintHelpOnePolicy(cmDocumentation *this,ostream *os)

{
  bool bVar1;
  ostream *poVar2;
  cmDocumentation *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string pname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc0,(string *)&this->CurrentArgument);
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (cmDocumentation *)&stack0xffffffffffffffa0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 "policy/",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffffc0);
  bVar1 = PrintFiles(this_00,os,(string *)&stack0xffffffffffffffa0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  if (!bVar1) {
    poVar2 = std::operator<<(os,"Argument \"");
    poVar2 = std::operator<<(poVar2,(string *)&this->CurrentArgument);
    std::operator<<(poVar2,"\" to --help-policy is not a CMake policy.\n");
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  return bVar1;
}

Assistant:

bool cmDocumentation::PrintHelpOnePolicy(std::ostream& os)
{
  std::string pname = this->CurrentArgument;
  std::vector<std::string> files;
  if (this->PrintFiles(os, "policy/" + pname)) {
    return true;
  }

  // Argument was not a policy.  Complain.
  os << "Argument \"" << this->CurrentArgument
     << "\" to --help-policy is not a CMake policy.\n";
  return false;
}